

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall
FastVector<SmallBlock<128>_*,_false,_false>::grow_and_add
          (FastVector<SmallBlock<128>_*,_false,_false> *this,uint newSize,SmallBlock<128> **val)

{
  uint uVar1;
  SmallBlock<128> **ppSVar2;
  SmallBlock<128> *pSVar3;
  
  ppSVar2 = this->data;
  grow_no_destroy(this,newSize);
  pSVar3 = *val;
  uVar1 = this->count;
  this->count = uVar1 + 1;
  this->data[uVar1] = pSVar3;
  if (ppSVar2 != (SmallBlock<128> **)0x0) {
    (*(code *)NULLC::dealloc)(ppSVar2);
    return;
  }
  return;
}

Assistant:

void grow_and_add(unsigned newSize, const T& val)
	{
		T* oldData = data;
		unsigned oldMax = max;

		grow_no_destroy(newSize);

		data[count++] = val;

		if(oldData)
		{
			if(!skipConstructor)
				NULLC::destruct(oldData, oldMax);
			else
				NULLC::alignedDealloc(oldData);
		}
	}